

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O3

int test_cmdline_callback_(int id,char *arg)

{
  test_detail_ *ptVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  void *pvVar5;
  char *pcVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  size_t local_50;
  
  if (id < 0x53) {
LAB_00104b07:
    if (-1 < id) {
      if (id != 0) {
        if (id == 0x43) {
          test_colorize_ = 0;
          return 0;
        }
        if (id == 0x45) {
          test_no_exec_ = 1;
          return 0;
        }
        return 0;
      }
      if (test_list_size_ == '\x01') {
        lVar7 = 0;
        do {
          iVar2 = strcmp(*(char **)((long)&test_list_[0].name + lVar7),arg);
          ptVar1 = test_details_;
          if (iVar2 == 0) {
            if (((&test_details_->flags)[lVar7] & 1) == 0) {
              (&test_details_->flags)[lVar7] = (&test_details_->flags)[lVar7] | 1;
              test_count_ = test_count_ + 1;
              return 0;
            }
            return 0;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x40);
        local_50 = test_count_;
        lVar7 = 0;
        iVar2 = 0;
        do {
          pcVar6 = test_list_[lVar7].name;
          sVar3 = strlen(arg);
          for (pcVar4 = strstr(pcVar6,arg); pcVar4 != (char *)0x0; pcVar4 = strstr(pcVar4 + 1,arg))
          {
            bVar9 = true;
            bVar8 = true;
            if (pcVar4 != pcVar6) {
              pvVar5 = memchr(test_name_contains_word__word_delim,(int)pcVar4[-1],10);
              bVar8 = pvVar5 != (void *)0x0;
            }
            if (pcVar4[sVar3] != '\0') {
              pvVar5 = memchr(test_name_contains_word__word_delim,(int)pcVar4[sVar3],10);
              bVar9 = pvVar5 != (void *)0x0;
            }
            if ((bool)(bVar8 & bVar9)) {
              if ((ptVar1[lVar7].flags & 1) == 0) {
                ptVar1[lVar7].flags = ptVar1[lVar7].flags | 1;
                test_count_ = local_50 + 1;
                local_50 = test_count_;
              }
              iVar2 = iVar2 + 1;
              break;
            }
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 4);
        if (0 < iVar2) {
          return 0;
        }
        lVar7 = 0;
        do {
          pcVar6 = strstr(*(char **)((long)&test_list_[0].name + lVar7),arg);
          if (pcVar6 != (char *)0x0) {
            if (((&ptVar1->flags)[lVar7] & 1) == 0) {
              (&ptVar1->flags)[lVar7] = (&ptVar1->flags)[lVar7] | 1;
              test_count_ = local_50 + 1;
              local_50 = test_count_;
            }
            iVar2 = iVar2 + 1;
          }
          lVar7 = lVar7 + 0x10;
        } while (lVar7 != 0x40);
        if (iVar2 != 0) {
          return 0;
        }
      }
      test_cmdline_callback__cold_4();
switchD_00104aaf_caseD_76:
      if (arg != (char *)0x0) {
        test_verbose_level_ = atoi(arg);
        return 0;
      }
      test_verbose_level_ = test_verbose_level_ + 1;
      return 0;
    }
    if (id == -0x7fffffff) {
      test_cmdline_callback__cold_3();
    }
    else if (id != -0x7ffffffe) {
      if (id != -0x7ffffffd) {
        return 0;
      }
      test_cmdline_callback__cold_1();
      id = (int)arg;
      goto switchD_00104aaf_default;
    }
    test_cmdline_callback__cold_2();
switchD_00104aaf_caseD_6c:
    test_list_names_();
LAB_00104ebe:
    exit(0);
  }
  switch(id) {
  case 99:
    if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
      test_colorize_ = 1;
      return 0;
    }
    iVar2 = strcmp(arg,"never");
    if (iVar2 == 0) {
      test_colorize_ = 0;
      return 0;
    }
    iVar2 = strcmp(arg,"auto");
    if (iVar2 == 0) {
      return 0;
    }
    pcVar6 = arg;
    test_cmdline_callback__cold_6();
    id = (int)pcVar6;
    goto LAB_00104b07;
  case 100:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6d:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x72:
  case 0x75:
    break;
  case 0x65:
    if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"always"), iVar2 == 0)) {
      test_no_exec_ = 0;
      return 0;
    }
    iVar2 = strcmp(arg,"never");
    if (iVar2 == 0) {
      test_no_exec_ = 1;
      return 0;
    }
    iVar2 = strcmp(arg,"auto");
    if (iVar2 == 0) {
      return 0;
    }
    test_cmdline_callback__cold_8();
  case 0x73:
    test_skip_mode_ = 1;
    break;
  case 0x68:
    test_help_();
    goto LAB_00104ebe;
  case 0x6c:
    goto switchD_00104aaf_caseD_6c;
  case 0x71:
    test_verbose_level_ = 0;
    break;
  case 0x74:
    if ((arg == (char *)0x0) || (iVar2 = strcmp(arg,"real"), iVar2 == 0)) {
      test_timer_ = 1;
    }
    else {
      iVar2 = strcmp(arg,"cpu");
      if (iVar2 != 0) {
        test_cmdline_callback__cold_7();
      }
      test_timer_ = 2;
    }
    break;
  case 0x76:
    goto switchD_00104aaf_caseD_76;
  case 0x77:
    test_worker_ = 1;
    test_worker_index_ = atoi(arg);
    break;
  case 0x78:
    test_xml_output_ = (FILE *)fopen(arg,"w");
    if ((FILE *)test_xml_output_ != (FILE *)0x0) {
      return 0;
    }
    test_cmdline_callback__cold_5();
    goto LAB_00104e38;
  default:
switchD_00104aaf_default:
    if (id != 0x53) {
      if (id == 0x54) {
        test_tap_ = 1;
        return 0;
      }
      return 0;
    }
LAB_00104e38:
    test_no_summary_ = 1;
  }
  return 0;
}

Assistant:

static int
test_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 's':
            test_skip_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                test_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'E':
            test_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                test_timer_ = 1;
#ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                test_timer_ = 2;
#endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
#endif
            break;

        case 'S':
            test_no_summary_ = 1;
            break;

        case 'T':
            test_tap_ = 1;
            break;

        case 'l':
            test_list_names_();
            exit(0);

        case 'v':
            test_verbose_level_ = (arg != NULL ? atoi(arg) : test_verbose_level_+1);
            break;

        case 'q':
            test_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                test_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                test_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
                exit(2);
            }
            break;

        case 'C':
            test_colorize_ = 0;
            break;

        case 'h':
            test_help_();
            exit(0);

        case 'w':
            test_worker_ = 1;
            test_worker_index_ = atoi(arg);
            break;
        case 'x':
            test_xml_output_ = fopen(arg, "w");
            if (!test_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                exit(2);
            }
            break;

        case 0:
            if(test_lookup_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", test_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", test_argv0_);
                exit(2);
            }
            break;

        case TEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);

        case TEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", test_argv0_);
            exit(2);
    }

    return 0;
}